

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

bool wasm::String::wildcardMatch(string *pattern,string *value)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  bool local_db;
  bool local_da;
  string local_c0;
  byte local_99;
  string local_98;
  string local_68;
  string local_48;
  ulong local_28;
  size_t i;
  string *value_local;
  string *pattern_local;
  
  local_28 = 0;
  i = (size_t)value;
  value_local = pattern;
  do {
    uVar2 = local_28;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= uVar2) {
      lVar6 = std::__cxx11::string::size();
      lVar7 = std::__cxx11::string::size();
      pattern_local._7_1_ = lVar6 == lVar7;
LAB_01546a1f:
      return (bool)(pattern_local._7_1_ & 1);
    }
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value_local);
    uVar2 = local_28;
    if (*pcVar5 == '*') {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)value_local);
      local_99 = 0;
      bVar8 = false;
      std::__cxx11::string::substr((ulong)&local_68,i);
      bVar3 = wildcardMatch(&local_48,&local_68);
      local_da = true;
      if (!bVar3) {
        lVar6 = std::__cxx11::string::size();
        bVar8 = lVar6 != 0;
        local_db = false;
        if (bVar8) {
          std::__cxx11::string::substr((ulong)&local_98,(ulong)value_local);
          local_99 = 1;
          std::__cxx11::string::substr((ulong)&local_c0,i);
          local_db = wildcardMatch(&local_98,&local_c0);
        }
        local_da = local_db;
      }
      pattern_local._7_1_ = local_da;
      if (bVar8) {
        std::__cxx11::string::~string((string *)&local_c0);
      }
      if ((local_99 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_98);
      }
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      goto LAB_01546a1f;
    }
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= uVar2) {
      pattern_local._7_1_ = 0;
      goto LAB_01546a1f;
    }
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)value_local);
    cVar1 = *pcVar5;
    pcVar5 = (char *)std::__cxx11::string::operator[](i);
    if (cVar1 != *pcVar5) {
      pattern_local._7_1_ = 0;
      goto LAB_01546a1f;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

inline bool wildcardMatch(const std::string& pattern,
                          const std::string& value) {
  for (size_t i = 0; i < pattern.size(); i++) {
    if (pattern[i] == '*') {
      return wildcardMatch(pattern.substr(i + 1), value.substr(i)) ||
             (value.size() > 0 &&
              wildcardMatch(pattern.substr(i), value.substr(i + 1)));
    }
    if (i >= value.size()) {
      return false;
    }
    if (pattern[i] != value[i]) {
      return false;
    }
  }
  return value.size() == pattern.size();
}